

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint32_t croaring_detect_supported_architectures(void)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint in_XCR0;
  
  if (croaring_detect_supported_architectures::buffer == 0x8000) {
    croaring_detect_supported_architectures::buffer = 0;
    lVar1 = cpuid_Version_info(1);
    uVar2 = *(uint *)(lVar1 + 0xc);
    if ((((uVar2 >> 0x14 & 1) != 0) &&
        (croaring_detect_supported_architectures::buffer = (uVar2 & 2) * 8 + 8,
        (~uVar2 & 0xc000000) == 0)) && ((in_XCR0 & 4) != 0)) {
      lVar1 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar2 = *(uint *)(lVar1 + 4);
      uVar3 = *(uint *)(lVar1 + 0xc);
      croaring_detect_supported_architectures::buffer =
           croaring_detect_supported_architectures::buffer |
           (uVar2 >> 3 & 4) + (uVar2 & 8) * 4 | uVar2 >> 2 & 0x40;
      if ((~in_XCR0 & 0xe0) == 0) {
        croaring_detect_supported_architectures::buffer =
             croaring_detect_supported_architectures::buffer |
             uVar2 >> 8 & 0x300 | uVar3 & 0x1000 | uVar2 >> 0x14 & 0x400 | (uVar3 & 0x40) << 5 |
             uVar3 >> 1 & 0x2000;
      }
    }
    LOCK();
    UNLOCK();
  }
  return croaring_detect_supported_architectures::buffer;
}

Assistant:

static uint32_t croaring_detect_supported_architectures(void) {
    // we use an atomic for thread safety
    static _Atomic uint32_t buffer = CROARING_UNINITIALIZED;
    if (buffer == CROARING_UNINITIALIZED) {
        // atomicity is sufficient
        buffer = dynamic_croaring_detect_supported_architectures();
    }
    return buffer;
}